

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_submodule * lys_sub_parse_fd(lys_module *module,int fd,LYS_INFORMAT format,unres_schema *unres)

{
  char *data;
  LY_ERR *pLVar1;
  lys_submodule *plVar2;
  size_t local_30;
  size_t length;
  
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x4cd,
                  "struct lys_submodule *lys_sub_parse_fd(struct lys_module *, int, LYS_INFORMAT, struct unres_schema *)"
                 );
  }
  if (-1 < fd) {
    data = (char *)lyp_mmap(fd,(ulong)(format == LYS_IN_YANG),&local_30);
    if (data == (char *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EINVAL;
      plVar2 = (lys_submodule *)0x0;
      ly_log(LY_LLERR,"Empty submodule schema file.");
    }
    else if (data == (char *)0xffffffffffffffff) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_ESYS;
      plVar2 = (lys_submodule *)0x0;
      ly_log(LY_LLERR,"Mapping file descriptor into memory failed (%s()).","lys_sub_parse_fd");
    }
    else {
      if ((module->field_0x40 & 1) != 0) {
        module = (lys_module *)module->data;
      }
      if (format == LYS_IN_YANG) {
        plVar2 = yang_read_submodule(module,data,0,unres);
      }
      else {
        if (format != LYS_IN_YIN) {
          pLVar1 = ly_errno_location();
          *pLVar1 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                 ,0x4e4);
          return (lys_submodule *)0x0;
        }
        plVar2 = yin_read_submodule(module,data,unres);
      }
      lyp_munmap(data,local_30);
    }
    return plVar2;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                ,0x4ce,
                "struct lys_submodule *lys_sub_parse_fd(struct lys_module *, int, LYS_INFORMAT, struct unres_schema *)"
               );
}

Assistant:

struct lys_submodule *
lys_sub_parse_fd(struct lys_module *module, int fd, LYS_INFORMAT format, struct unres_schema *unres)
{
    struct lys_submodule *submodule;
    size_t length;
    char *addr;

    assert(module);
    assert(fd >= 0);

    addr = lyp_mmap(fd, format == LYS_IN_YANG ? 1 : 0, &length);
    if (addr == MAP_FAILED) {
        LOGERR(LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!addr) {
        LOGERR(LY_EINVAL, "Empty submodule schema file.");
        return NULL;
    }

    /* get the main module */
    module = lys_main_module(module);

    switch (format) {
    case LYS_IN_YIN:
        submodule = yin_read_submodule(module, addr, unres);
        break;
    case LYS_IN_YANG:
        submodule = yang_read_submodule(module, addr, 0, unres);
        break;
    default:
        LOGINT;
        return NULL;
    }

    lyp_munmap(addr, length);
    return submodule;

}